

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

string * __thiscall adios2::transport::FileHTTP::SysErrMsg_abi_cxx11_(FileHTTP *this)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_70 [28];
  int in_stack_ffffffffffffffac;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffac);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  strerror(*(int *)(in_RSI + 0xf4));
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  return __lhs;
}

Assistant:

std::string FileHTTP::SysErrMsg() const
{
    return std::string(": errno = " + std::to_string(m_Errno) + ": " + strerror(m_Errno));
}